

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O3

qsizetype QRandomGenerator::SystemGenerator::fillBuffer(void *buffer,qsizetype count)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = 0;
  lVar1 = count;
  pvVar3 = buffer;
  if (0x100 < count) {
    do {
      getentropy(pvVar3,0x100);
      lVar1 = count + lVar2;
      lVar2 = lVar2 + -0x100;
      pvVar3 = (void *)((long)pvVar3 + 0x100);
    } while (0x100 < lVar1 + -0x100);
    lVar1 = count + lVar2;
    lVar2 = -lVar2;
  }
  getentropy((long)buffer + lVar2,lVar1);
  return count;
}

Assistant:

static qsizetype fillBuffer(void *buffer, qsizetype count) noexcept
    {
        // getentropy can read at most 256 bytes, so break the reading
        qsizetype read = 0;
        while (count - read > 256) {
            // getentropy can't fail under normal circumstances
            int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, 256);
            Q_ASSERT(ret == 0);
            Q_UNUSED(ret);
            read += 256;
        }

        int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, count - read);
        Q_ASSERT(ret == 0);
        Q_UNUSED(ret);
        return count;
    }